

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu384a.c
# Opt level: O2

MPP_RET hal_h265d_vdpu384a_init(void *hal,MppHalCfg *cfg)

{
  SlotHalFbcAdjCfg *pSVar1;
  MPP_RET MVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  undefined8 *puVar8;
  MppBufferGroup group;
  int *piVar9;
  
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_HOR_ALIGN,mpp_align_128_odd_plus_64);
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_VER_ALIGN,hevc_ver_align);
  pvVar4 = mpp_osal_calloc("hal_h265d_vdpu384a_init",1000);
  *(void **)((long)hal + 0x1a0) = pvVar4;
  if (pvVar4 == (void *)0x0) {
    pcVar5 = "scaling_org alloc fail";
LAB_001ec705:
    _mpp_log_l(2,"hal_h265d_vdpu384a",pcVar5,(char *)0x0);
    return MPP_ERR_MALLOC;
  }
  pvVar4 = mpp_osal_calloc("hal_h265d_vdpu384a_init",0x550);
  *(void **)((long)hal + 0x198) = pvVar4;
  pvVar4 = mpp_osal_calloc("hal_h265d_vdpu384a_init",0x120);
  *(void **)((long)hal + 0x208) = pvVar4;
  if (*(long *)((long)hal + 0x198) == 0) {
    pcVar5 = "scaling_rk alloc fail";
    goto LAB_001ec705;
  }
  group = *(MppBufferGroup *)((long)hal + 0x30);
  if (group == (MppBufferGroup)0x0) {
    MVar2 = mpp_buffer_group_get
                      ((MppBufferGroup *)((long)hal + 0x30),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                       "hal_h265d_vdpu384a","hal_h265d_vdpu384a_init");
    if (MVar2 != MPP_OK) {
      pcVar5 = "h265d mpp_buffer_group_get failed\n";
      goto LAB_001ec750;
    }
    group = *(MppBufferGroup *)((long)hal + 0x30);
  }
  uVar6 = (uint)(*(int *)((long)hal + 0x180) != 0) * 2 + 1;
  MVar2 = mpp_buffer_get_with_tag
                    (group,(MppBuffer *)((long)hal + 0x1c8),(ulong)(uVar6 * 0x1b120),
                     "hal_h265d_vdpu384a","hal_h265d_vdpu384a_init");
  if (MVar2 == MPP_OK) {
    iVar3 = mpp_buffer_get_fd_with_caller
                      (*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu384a_init");
    *(int *)((long)hal + 0x1d0) = iVar3;
    piVar9 = (int *)((long)hal + 0x1d8);
    puVar8 = (undefined8 *)((long)hal + 0x128);
    for (lVar7 = 0; (ulong)uVar6 * 0x1b120 - lVar7 != 0; lVar7 = lVar7 + 0x1b120) {
      pvVar4 = mpp_osal_calloc("hal_h265d_vdpu384a_init",0x298);
      *puVar8 = pvVar4;
      *piVar9 = (int)lVar7;
      piVar9[6] = (int)lVar7 + 0x120;
      piVar9 = piVar9 + 1;
      puVar8 = puVar8 + 5;
    }
    mpp_buffer_attach_dev_f
              ("hal_h265d_vdpu384a_init",*(MppBuffer *)((long)hal + 0x1c8),
               *(MppDev *)((long)hal + 0x10));
    if (*(int *)((long)hal + 0x180) == 0) {
      *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + 0x128);
      *(undefined4 *)((long)hal + 0x1fc) = *(undefined4 *)((long)hal + 0x1d8);
      *(undefined4 *)((long)hal + 0x204) = *(undefined4 *)((long)hal + 0x1f0);
    }
    pSVar1 = cfg->hal_fbc_adj_cfg;
    if (pSVar1 == (SlotHalFbcAdjCfg *)0x0) {
      return MPP_OK;
    }
    pSVar1->func = vdpu384a_afbc_align_calc;
    pSVar1->expand = 0x10;
    return MPP_OK;
  }
  pcVar5 = "h265d mpp_buffer_get failed\n";
LAB_001ec750:
  _mpp_log_l(2,"hal_h265d_vdpu384a",pcVar5,(char *)0x0);
  return MVar2;
}

Assistant:

static MPP_RET hal_h265d_vdpu384a_init(void *hal, MppHalCfg *cfg)
{
    RK_S32 ret = 0;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;

    mpp_slots_set_prop(reg_ctx->slots, SLOTS_HOR_ALIGN, mpp_align_128_odd_plus_64);
    mpp_slots_set_prop(reg_ctx->slots, SLOTS_VER_ALIGN, hevc_ver_align);

    reg_ctx->scaling_qm = mpp_calloc(DXVA_Qmatrix_HEVC, 1);
    if (reg_ctx->scaling_qm == NULL) {
        mpp_err("scaling_org alloc fail");
        return MPP_ERR_MALLOC;
    }

    reg_ctx->scaling_rk = mpp_calloc(scalingFactor_t, 1);
    reg_ctx->pps_buf = mpp_calloc(RK_U8, SPSPPS_ALIGNED_SIZE);

    if (reg_ctx->scaling_rk == NULL) {
        mpp_err("scaling_rk alloc fail");
        return MPP_ERR_MALLOC;
    }

    if (reg_ctx->group == NULL) {
        ret = mpp_buffer_group_get_internal(&reg_ctx->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("h265d mpp_buffer_group_get failed\n");
            return ret;
        }
    }

    {
        RK_U32 i = 0;
        RK_U32 max_cnt = reg_ctx->fast_mode ? MAX_GEN_REG : 1;

        //!< malloc buffers
        ret = mpp_buffer_get(reg_ctx->group, &reg_ctx->bufs, ALL_BUFFER_SIZE(max_cnt));
        if (ret) {
            mpp_err("h265d mpp_buffer_get failed\n");
            return ret;
        }

        reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
        for (i = 0; i < max_cnt; i++) {
            reg_ctx->g_buf[i].hw_regs = mpp_calloc_size(void, sizeof(Vdpu384aH265dRegSet));
            reg_ctx->offset_spspps[i] = SPSPPS_OFFSET(i);
            reg_ctx->offset_sclst[i] = SCALIST_OFFSET(i);
        }

        mpp_buffer_attach_dev(reg_ctx->bufs, reg_ctx->dev);
    }

    if (!reg_ctx->fast_mode) {
        reg_ctx->hw_regs = reg_ctx->g_buf[0].hw_regs;
        reg_ctx->spspps_offset = reg_ctx->offset_spspps[0];
        reg_ctx->sclst_offset = reg_ctx->offset_sclst[0];
    }

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu384a_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 16;
    }

    (void) cfg;
    return MPP_OK;
}